

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

void CVmObjString::parse_num_val(vm_val_t *retval,char *str,size_t len,int radix,int int_only)

{
  vm_datatype_t vVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  vm_obj_id_t vVar5;
  ulong uVar6;
  uint uVar7;
  vm_obj_id_t vVar8;
  ulong uVar9;
  bool bVar10;
  size_t rem;
  utf8_ptr local_70;
  undefined4 local_64;
  utf8_ptr p2;
  size_t rem2;
  int local_4c;
  char *local_48;
  size_t local_40;
  vm_val_t *local_38;
  
  rem = len;
  local_70.p_ = str;
  local_48 = str;
  local_40 = len;
  local_38 = retval;
  while (rem != 0) {
    wVar2 = utf8_ptr::s_getch(local_70.p_);
    iVar3 = t3_is_whitespace(wVar2);
    if (iVar3 == 0) {
      if (rem != 0) {
        wVar4 = utf8_ptr::s_getch(local_70.p_);
        bVar10 = wVar4 != L'-';
        wVar2 = wVar4;
        if ((!bVar10) || (wVar2 = utf8_ptr::s_getch(local_70.p_), wVar2 == L'+')) {
          local_64 = CONCAT31((int3)((uint)wVar2 >> 8),wVar4 == L'-');
          utf8_ptr::inc(&local_70,&rem);
          goto LAB_002a60b2;
        }
      }
      break;
    }
    utf8_ptr::inc(&local_70,&rem);
  }
  local_64 = 0;
  bVar10 = true;
LAB_002a60b2:
  while (rem != 0) {
    wVar2 = utf8_ptr::s_getch(local_70.p_);
    iVar3 = t3_is_whitespace(wVar2);
    if (iVar3 == 0) break;
    utf8_ptr::inc(&local_70,&rem);
  }
  uVar9 = 0;
  local_4c = int_only;
  while (rem != 0) {
    wVar2 = utf8_ptr::s_getch(local_70.p_);
    if (radix == 10 && int_only == 0) {
      if ((wVar2 == L'E') || (wVar2 == L'e')) {
        p2.p_ = local_70.p_;
        rem2 = rem;
        utf8_ptr::inc(&p2,&rem);
        if (rem2 != 0) {
          wVar4 = utf8_ptr::s_getch(p2.p_);
          if ((wVar4 == L'+') || (wVar4 = utf8_ptr::s_getch(p2.p_), wVar4 == L'-')) {
            utf8_ptr::inc(&p2,&rem2);
          }
          if ((rem2 != 0) &&
             (wVar4 = utf8_ptr::s_getch(p2.p_), 0xfffffff5 < (uint)(wVar4 + L'\xffffffc6')))
          goto LAB_002a6288;
        }
        goto LAB_002a61bc;
      }
      if (wVar2 != L'.') goto LAB_002a6139;
LAB_002a6288:
      radix = 10;
LAB_002a6267:
      vVar5 = CVmObjBigNum::create_radix(0,local_48,local_40,radix);
      vVar1 = VM_OBJ;
      goto LAB_002a626e;
    }
LAB_002a6139:
    uVar7 = wVar2 + L'\xffffffd0';
    if (9 < uVar7) {
LAB_002a61bc:
      if ((uint)(wVar2 + L'\xffffff9f') < 0x1a) {
        uVar7 = wVar2 + L'\xffffffa9';
      }
      else {
        if (0x19 < (uint)(wVar2 + L'\xffffffbf')) break;
        uVar7 = wVar2 + L'\xffffffc9';
      }
    }
    if (radix <= (int)uVar7) break;
    uVar6 = 0x80000000;
    if ((bVar10) &&
       ((0x10 < (uint)radix || (uVar6 = 0xffffffff, (0x10104U >> (radix & 0x1fU) & 1) == 0)))) {
      uVar6 = 0x7fffffff;
    }
    if (uVar6 / (uint)radix < uVar9) {
LAB_002a6252:
      if (local_4c != 0) {
        err_throw(0x7e7);
      }
      goto LAB_002a6267;
    }
    uVar9 = uVar9 * (uint)radix;
    uVar6 = uVar6 - uVar7;
    if (uVar6 <= uVar9 && uVar9 - uVar6 != 0) goto LAB_002a6252;
    uVar9 = uVar9 + uVar7;
    utf8_ptr::inc(&local_70,&rem);
  }
  vVar8 = (vm_obj_id_t)uVar9;
  vVar5 = -vVar8;
  if (0x7fffffff < uVar9) {
    vVar5 = vVar8;
  }
  if ((char)local_64 == '\0') {
    vVar5 = vVar8;
  }
  vVar1 = VM_INT;
LAB_002a626e:
  local_38->typ = vVar1;
  (local_38->val).obj = vVar5;
  return;
}

Assistant:

void CVmObjString::parse_num_val(VMG_ vm_val_t *retval,
                                 const char *str, size_t len,
                                 int radix, int int_only)
{
    utf8_ptr p;
    size_t rem;

    /* skip leading spaces */
    for (p.set((char *)str), rem = len ;
         rem != 0 && t3_is_whitespace(p.getch()) ; p.inc(&rem)) ;
    
    /* presume it's positive */
    int is_neg = FALSE;
    
    /* check for a leading + or - */
    if (rem != 0)
    {
        if (p.getch() == '-')
        {
            /* note the sign and skip the character */
            is_neg = TRUE;
            p.inc(&rem);
        }
        else if (p.getch() == '+')
        {
            /* skip the character */
            p.inc(&rem);
        }
    }

    /* skip any additional spaces after the sign */
    for ( ; rem != 0 && t3_is_whitespace(p.getch()) ; p.inc(&rem)) ;
    
    /* clear the accumulator */
    unsigned long acc = 0;
    
    /* scan the digits */
    for ( ; rem != 0 ; p.inc(&rem))
    {
        /* get the next digit */
        wchar_t ch = p.getch();

        /* 
         *   If we're allowed to promote to BigNumber, and the radix is
         *   decimal, check for '.' and 'E' (for exponent) notation.  These
         *   could indicate a floating point value.  
         */
        if (radix == 10 && !int_only && (ch == '.' || ch == 'e' || ch == 'E'))
        {
            /* presume we're going to promote to BigNumber */
            int promote = TRUE;
            
            /* 
             *   If it's an exponent, parse further to make sure it looks
             *   like a valid exponent: we can have an optional + or - sign,
             *   then need at least one digit.  
             */
            if (ch == 'e' || ch == 'E')
            {
                /* set up a second pointer */
                utf8_ptr p2(p);
                size_t rem2 = rem;

                /* skip the 'e' */
                p2.inc(&rem);

                /* if there's a sign, skip it */
                if (rem2 != 0 && (p2.getch() == '+' || p2.getch() == '-'))
                    p2.inc(&rem2);

                /* we need a digit at this point, or it's not an exponent */
                promote = (rem2 != 0 && is_digit(p2.getch()));
            }

            /* if we're promoting after all, go do the promotion */
            if (promote)
            {
                /* re-parse it as a BigNumber value */
                retval->set_obj(CVmObjBigNum::create_radix(
                    vmg_ FALSE, str, len, radix));

                /* return this value */
                return;
            }
        }

        /* get the integer value of the digit, treating A-Z as digits 10-35 */
        int dig;
        if (ch >= '0' && ch <= '9')
            dig = (int)(ch - '0');
        else if (ch >= 'a' && ch <= 'z')
            dig = (int)(ch - 'a' + 10);
        else if (ch >= 'A' && ch <= 'Z')
            dig = (int)(ch - 'A' + 10);
        else
            break;

        /* if it's outside the radix limit, it's not a digit after all */
        if (dig >= radix)
            break;

        /* 
         *   Make sure we're not going to overflow.  If the base is 2, 8, or
         *   16, and there wasn't a "-" sign, allow the value to go up to the
         *   unsigned 32-bit limit, 0xffffffff.  Otherwise, limit it to
         *   32-bit signed, -0x8000000 to +0x7ffffff.  
         */
        unsigned long limit =
            (!is_neg && (radix == 2 || radix == 8 || radix == 16))
            ? 0xffffffff
            : is_neg ? 0x80000000 : 0x7fffffff;
        
        /* shift the accumulator by the radix, checking for overflow */
        if (acc > limit/radix)
            goto overflow;
        acc *= radix;

        /* add the digit, checking for overflow */
        if (acc > limit - dig)
            goto overflow;
        acc += dig;
    }
    
    /* apply the sign, if appropriate, and set the return value */
    retval->set_int(is_neg && acc <= 0x7FFFFFFF ? -(long)acc : (long)acc);
    return;

overflow:
    /*
     *   We overflowed the plain integer type.  If we're allowed to promote
     *   to a BigNumber, re-parse the value as a BigNumber.  If not, it's an
     *   error.
     */
    if (int_only)
    {
        /* we can't promote to BigNumber - throw an overflow error */
        err_throw(VMERR_NUM_OVERFLOW);
    }
    else
    {
        /* re-parse it as a BigNumber value */
        retval->set_obj(CVmObjBigNum::create_radix(
            vmg_ FALSE, str, len, radix));
    }
}